

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lefreader.cpp
# Opt level: O0

bool __thiscall LEFReader::parseMacro(LEFReader *this)

{
  bool bVar1;
  __type_conflict _Var2;
  byte bVar3;
  token_t tVar4;
  allocator<char> local_b9;
  string local_b8;
  byte local_92;
  allocator<char> local_91;
  undefined1 local_90 [6];
  bool endFound;
  undefined4 local_70;
  allocator<char> local_69;
  string local_68;
  undefined1 local_38 [8];
  string name;
  LEFReader *this_local;
  
  name.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_38);
  tVar4 = tokenize(this,(string *)local_38);
  this->m_curtok = tVar4;
  if (this->m_curtok == TOK_IDENT) {
    tVar4 = tokenize(this,&this->m_tokstr);
    this->m_curtok = tVar4;
    if (this->m_curtok == TOK_EOL) {
      (*this->_vptr_LEFReader[2])(this,local_38);
      local_92 = 0;
      do {
        tVar4 = tokenize(this,&this->m_tokstr);
        this->m_curtok = tVar4;
        if (this->m_curtok == TOK_IDENT) {
          bVar1 = std::operator==(&this->m_tokstr,"PIN");
          if (bVar1) {
            parsePin(this);
          }
          else {
            bVar1 = std::operator==(&this->m_tokstr,"CLASS");
            if (bVar1) {
              parseClass(this);
            }
            else {
              bVar1 = std::operator==(&this->m_tokstr,"ORIGIN");
              if (bVar1) {
                parseOrigin(this);
              }
              else {
                bVar1 = std::operator==(&this->m_tokstr,"FOREIGN");
                if (bVar1) {
                  parseForeign(this);
                }
                else {
                  bVar1 = std::operator==(&this->m_tokstr,"SIZE");
                  if (bVar1) {
                    parseSize(this);
                  }
                  else {
                    bVar1 = std::operator==(&this->m_tokstr,"SYMMETRY");
                    if (bVar1) {
                      parseSymmetry(this);
                    }
                    else {
                      bVar1 = std::operator==(&this->m_tokstr,"SITE");
                      if (bVar1) {
                        parseSite(this);
                      }
                    }
                  }
                }
              }
            }
          }
        }
        if ((local_92 & 1) == 0) {
          if ((this->m_curtok == TOK_IDENT) &&
             (bVar1 = std::operator==(&this->m_tokstr,"END"), bVar1)) {
            local_92 = 1;
          }
          else {
            local_92 = 0;
          }
        }
        else if ((this->m_curtok == TOK_IDENT) &&
                (_Var2 = std::operator==(&this->m_tokstr,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_38), _Var2)) {
          this_local._7_1_ = true;
          goto LAB_00168880;
        }
        bVar3 = std::ios::eof();
      } while ((bVar3 & 1) == 0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"Unexpected end of file\n",&local_b9);
      error(this,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator(&local_b9);
      this_local._7_1_ = false;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_90,"Expected EOL\n",&local_91);
      error(this,(string *)local_90);
      std::__cxx11::string::~string((string *)local_90);
      std::allocator<char>::~allocator(&local_91);
      this_local._7_1_ = false;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"Expected a macro name\n",&local_69);
    error(this,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    this_local._7_1_ = false;
  }
LAB_00168880:
  local_70 = 1;
  std::__cxx11::string::~string((string *)local_38);
  return this_local._7_1_;
}

Assistant:

bool LEFReader::parseMacro()
{
    std::string name;
    

    // macro name
    m_curtok = tokenize(name);
    if (m_curtok != TOK_IDENT)
    {
        error("Expected a macro name\n");
        return false;
    }

    //std::cout << "MACRO " << name << "\n"; 

    // expect EOL
    m_curtok = tokenize(m_tokstr);
    if (m_curtok != TOK_EOL)
    {
        error("Expected EOL\n");
        return false;
    }

    onMacro(name);

    // wait for 'END macroname'
    bool endFound = false;
    while(true)
    {
        m_curtok = tokenize(m_tokstr);

        if (m_curtok == TOK_IDENT)
        {
            if (m_tokstr == "PIN")
            {
                parsePin();
            }
            else if (m_tokstr == "CLASS")
            {
                parseClass();
            }            
            else if (m_tokstr == "ORIGIN")
            {
                parseOrigin();
            }
            else if (m_tokstr == "FOREIGN")
            {
                parseForeign();
            }
            else if (m_tokstr == "SIZE")
            {
                parseSize();
            }
            else if (m_tokstr == "SYMMETRY")
            {
                parseSymmetry();
            }
            else if (m_tokstr == "SITE")
            {
                parseSite();
            }
            //else if (m_tokstr == "LAYER")
            //{
            //    parseLayer();   // TECH LEF layer, not a port LAYER!
            //}  
        }

        if (endFound)
        {
            if ((m_curtok == TOK_IDENT) && (m_tokstr == name))
            {
                //cout << "END " << name << "\n";
                return true;
            }
        }
        else if ((m_curtok == TOK_IDENT) && (m_tokstr == "END"))
        {
            endFound = true;
        }
        else
        {
            endFound = false;
        }

        if (m_is->eof())
        {
            error("Unexpected end of file\n");
            return false;
        }        
    }
}